

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::ParseProtoMapField(Parser *this,StructDef *struct_def)

{
  string *psVar1;
  bool bVar2;
  ulong uVar3;
  Value *this_00;
  string *in_RDX;
  int t;
  allocator<char> local_1f9;
  string local_1f8;
  Value *local_1d8;
  Value *val;
  long local_1c8;
  FieldDef *field;
  Type field_type;
  Type local_198;
  byte local_171;
  FieldDef *value_field;
  Type local_160;
  byte local_139;
  long local_138;
  FieldDef *key_field;
  string *local_128;
  StructDef *entry_table;
  undefined1 local_100 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> entry_table_name;
  string local_d8 [8];
  string proto_field_id;
  undefined1 local_b0 [8];
  string field_name;
  undefined1 local_88 [8];
  Type value_type;
  undefined1 local_60 [8];
  Type key_type;
  StructDef *struct_def_local;
  Parser *this_local;
  CheckedError *ce;
  
  Next(this);
  bVar2 = CheckedError::Check((CheckedError *)this);
  if (!bVar2) {
    CheckedError::~CheckedError((CheckedError *)this);
    key_type._31_1_ = 0;
    t = (int)struct_def;
    Expect(this,t);
    bVar2 = CheckedError::Check((CheckedError *)this);
    if (bVar2) {
      key_type._31_1_ = 1;
    }
    if ((key_type._31_1_ & 1) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (!bVar2) {
      Type::Type((Type *)local_60,BASE_TYPE_NONE,(StructDef *)0x0,(EnumDef *)0x0,0);
      value_type._31_1_ = 0;
      ParseType(this,(Type *)struct_def);
      bVar2 = CheckedError::Check((CheckedError *)this);
      if (bVar2) {
        value_type._31_1_ = 1;
      }
      if ((value_type._31_1_ & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (!bVar2) {
        value_type._30_1_ = 0;
        Expect(this,t);
        bVar2 = CheckedError::Check((CheckedError *)this);
        if (bVar2) {
          value_type._30_1_ = 1;
        }
        if ((value_type._30_1_ & 1) == 0) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
        if (!bVar2) {
          Type::Type((Type *)local_88,BASE_TYPE_NONE,(StructDef *)0x0,(EnumDef *)0x0,0);
          field_name.field_2._M_local_buf[0xf] = '\0';
          ParseType(this,(Type *)struct_def);
          bVar2 = CheckedError::Check((CheckedError *)this);
          if (bVar2) {
            field_name.field_2._M_local_buf[0xf] = '\x01';
          }
          if ((field_name.field_2._M_local_buf[0xf] & 1U) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if (!bVar2) {
            field_name.field_2._M_local_buf[0xe] = '\0';
            Expect(this,t);
            bVar2 = CheckedError::Check((CheckedError *)this);
            if (bVar2) {
              field_name.field_2._M_local_buf[0xe] = '\x01';
            }
            if ((field_name.field_2._M_local_buf[0xe] & 1U) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (!bVar2) {
              std::__cxx11::string::string
                        ((string *)local_b0,
                         (string *)&(struct_def->super_Definition).file._M_string_length);
              proto_field_id.field_2._M_local_buf[0xf] = '\0';
              Next(this);
              bVar2 = CheckedError::Check((CheckedError *)this);
              if (bVar2) {
                proto_field_id.field_2._M_local_buf[0xf] = '\x01';
              }
              if ((proto_field_id.field_2._M_local_buf[0xf] & 1U) == 0) {
                CheckedError::~CheckedError((CheckedError *)this);
              }
              if (!bVar2) {
                proto_field_id.field_2._M_local_buf[0xe] = '\0';
                Expect(this,t);
                bVar2 = CheckedError::Check((CheckedError *)this);
                if (bVar2) {
                  proto_field_id.field_2._M_local_buf[0xe] = '\x01';
                }
                if ((proto_field_id.field_2._M_local_buf[0xe] & 1U) == 0) {
                  CheckedError::~CheckedError((CheckedError *)this);
                }
                if (!bVar2) {
                  std::__cxx11::string::string
                            (local_d8,(string *)
                                      &(struct_def->super_Definition).file._M_string_length);
                  entry_table_name.field_2._M_local_buf[0xf] = '\0';
                  Expect(this,t);
                  bVar2 = CheckedError::Check((CheckedError *)this);
                  if (bVar2) {
                    entry_table_name.field_2._M_local_buf[0xf] = '\x01';
                  }
                  if ((entry_table_name.field_2._M_local_buf[0xf] & 1U) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (!bVar2) {
                    entry_table_name.field_2._M_local_buf[0xe] = '\0';
                    Expect(this,t);
                    bVar2 = CheckedError::Check((CheckedError *)this);
                    if (bVar2) {
                      entry_table_name.field_2._M_local_buf[0xe] = '\x01';
                    }
                    if ((entry_table_name.field_2._M_local_buf[0xe] & 1U) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (!bVar2) {
                      ConvertCase((string *)&entry_table,(string *)local_b0,kUpperCamel,kSnake);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_100,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&entry_table,"Entry");
                      std::__cxx11::string::~string((string *)&entry_table);
                      key_field._7_1_ = 0;
                      StartStruct(this,(string *)struct_def,(StructDef **)local_100);
                      bVar2 = CheckedError::Check((CheckedError *)this);
                      if (bVar2) {
                        key_field._7_1_ = 1;
                      }
                      if ((key_field._7_1_ & 1) == 0) {
                        CheckedError::~CheckedError((CheckedError *)this);
                      }
                      psVar1 = local_128;
                      if (!bVar2) {
                        local_128[8].field_2._M_local_buf[3] = '\x01';
                        local_139 = 0;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_160,"key",
                                   (allocator<char> *)((long)&value_field + 7));
                        AddField(this,struct_def,psVar1,&local_160,(FieldDef **)local_60);
                        std::__cxx11::string::~string((string *)&local_160);
                        std::allocator<char>::~allocator
                                  ((allocator<char> *)((long)&value_field + 7));
                        bVar2 = CheckedError::Check((CheckedError *)this);
                        if (bVar2) {
                          local_139 = 1;
                        }
                        if ((local_139 & 1) == 0) {
                          CheckedError::~CheckedError((CheckedError *)this);
                        }
                        psVar1 = local_128;
                        if (!bVar2) {
                          *(undefined1 *)(local_138 + 0x111) = 1;
                          local_171 = 0;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_198,"value",
                                     (allocator<char> *)&field_type.field_0x1f);
                          AddField(this,struct_def,psVar1,&local_198,(FieldDef **)local_88);
                          std::__cxx11::string::~string((string *)&local_198);
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)&field_type.field_0x1f);
                          bVar2 = CheckedError::Check((CheckedError *)this);
                          if (bVar2) {
                            local_171 = 1;
                          }
                          if ((local_171 & 1) == 0) {
                            CheckedError::~CheckedError((CheckedError *)this);
                          }
                          if (!bVar2) {
                            Type::Type((Type *)&field,BASE_TYPE_NONE,(StructDef *)0x0,(EnumDef *)0x0
                                       ,0);
                            field._0_4_ = 0xe;
                            field._4_4_ = 0xf;
                            field_type._0_8_ = local_128;
                            val._7_1_ = 0;
                            AddField(this,struct_def,in_RDX,(Type *)local_b0,&field);
                            bVar2 = CheckedError::Check((CheckedError *)this);
                            if (bVar2) {
                              val._7_1_ = 1;
                            }
                            if ((val._7_1_ & 1) == 0) {
                              CheckedError::~CheckedError((CheckedError *)this);
                            }
                            if (!bVar2) {
                              uVar3 = std::__cxx11::string::empty();
                              if ((uVar3 & 1) == 0) {
                                this_00 = (Value *)operator_new(0x48);
                                Value::Value(this_00);
                                local_1d8 = this_00;
                                std::__cxx11::string::operator=
                                          ((string *)&this_00->constant,local_d8);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_1f8,"id",&local_1f9);
                                SymbolTable<flatbuffers::Value>::Add
                                          ((SymbolTable<flatbuffers::Value> *)(local_1c8 + 0x58),
                                           &local_1f8,local_1d8);
                                std::__cxx11::string::~string((string *)&local_1f8);
                                std::allocator<char>::~allocator(&local_1f9);
                              }
                              anon_unknown_0::NoError();
                            }
                          }
                        }
                      }
                      std::__cxx11::string::~string((string *)local_100);
                    }
                  }
                  std::__cxx11::string::~string(local_d8);
                }
              }
              std::__cxx11::string::~string((string *)local_b0);
            }
          }
        }
      }
    }
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseProtoMapField(StructDef *struct_def) {
  NEXT();
  EXPECT('<');
  Type key_type;
  ECHECK(ParseType(key_type));
  EXPECT(',');
  Type value_type;
  ECHECK(ParseType(value_type));
  EXPECT('>');
  auto field_name = attribute_;
  NEXT();
  EXPECT('=');
  std::string proto_field_id = attribute_;
  EXPECT(kTokenIntegerConstant);
  EXPECT(';');

  auto entry_table_name = ConvertCase(field_name, Case::kUpperCamel) + "Entry";
  StructDef *entry_table;
  ECHECK(StartStruct(entry_table_name, &entry_table));
  entry_table->has_key = true;
  FieldDef *key_field;
  ECHECK(AddField(*entry_table, "key", key_type, &key_field));
  key_field->key = true;
  FieldDef *value_field;
  ECHECK(AddField(*entry_table, "value", value_type, &value_field));

  Type field_type;
  field_type.base_type = BASE_TYPE_VECTOR;
  field_type.element = BASE_TYPE_STRUCT;
  field_type.struct_def = entry_table;
  FieldDef *field;
  ECHECK(AddField(*struct_def, field_name, field_type, &field));
  if (!proto_field_id.empty()) {
    auto val = new Value();
    val->constant = proto_field_id;
    field->attributes.Add("id", val);
  }

  return NoError();
}